

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

bool __thiscall t_php_generator::php_is_scalar(t_php_generator *this,t_type *ttype)

{
  uint uVar1;
  t_type *ptVar2;
  t_type *ttype_local;
  t_php_generator *this_local;
  
  ptVar2 = t_type::get_true_type(ttype);
  uVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptVar2->super_t_doc)._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool php_is_scalar(t_type *ttype) {
    ttype = ttype->get_true_type();
    if(ttype->is_base_type()) {
      return true;
    } else if(ttype->is_enum()) {
      return true;
    } else {
      return false;
    }
  }